

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter_inl.hpp
# Opt level: O1

string * __thiscall
CLI::Formatter::make_subcommand_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *sub)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  pointer pcVar5;
  size_t paragraphWidth;
  long *plVar6;
  undefined8 *puVar7;
  ulong *puVar8;
  undefined8 uVar9;
  ulong uVar10;
  string name;
  stringstream out;
  string local_278;
  ulong *local_258;
  long local_250;
  ulong local_248;
  long lStack_240;
  char *local_238;
  long local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [2];
  long lStack_198;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  App::get_display_name_abi_cxx11_(&local_218,sub,true);
  plVar6 = (long *)::std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,0x130fa1);
  paVar2 = &local_278.field_2;
  puVar8 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_278.field_2._M_allocated_capacity = *puVar8;
    local_278.field_2._8_4_ = (undefined4)plVar6[3];
    local_278.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
    local_278._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar8;
    local_278._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_278._M_string_length = plVar6[1];
  *plVar6 = (long)puVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  bVar4 = sub->required_;
  if (bVar4 == true) {
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"REQUIRED","");
    FormatterBase::get_label(&local_1d8,&this->super_FormatterBase,&local_1f8);
    plVar6 = (long *)::std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x130fa2);
    local_258 = &local_248;
    puVar8 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar8) {
      local_248 = *puVar8;
      lStack_240 = plVar6[3];
    }
    else {
      local_248 = *puVar8;
      local_258 = (ulong *)*plVar6;
    }
    local_250 = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
  }
  else {
    local_258 = &local_248;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"");
  }
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    uVar9 = local_278.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_250 + local_278._M_string_length) {
    uVar10 = 0xf;
    if (local_258 != &local_248) {
      uVar10 = local_248;
    }
    if (local_250 + local_278._M_string_length <= uVar10) {
      puVar7 = (undefined8 *)
               ::std::__cxx11::string::replace
                         ((ulong)&local_258,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
      goto LAB_0010d142;
    }
  }
  puVar7 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_258);
LAB_0010d142:
  local_238 = (char *)&local_228;
  pcVar1 = (char *)(puVar7 + 2);
  if ((char *)*puVar7 == pcVar1) {
    local_228 = *(undefined8 *)pcVar1;
    uStack_220 = puVar7[3];
  }
  else {
    local_228 = *(undefined8 *)pcVar1;
    local_238 = (char *)*puVar7;
  }
  local_230 = puVar7[1];
  *puVar7 = pcVar1;
  puVar7[1] = 0;
  *pcVar1 = '\0';
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  if (bVar4 != false) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  paVar3 = &local_218.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar3) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  *(long *)((long)&lStack_198 + *(long *)(local_1a8[0] + -0x18)) =
       (long)(int)(this->super_FormatterBase).column_width_;
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_238,local_230);
  pcVar5 = (sub->description_)._M_dataplus._M_p;
  local_278._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,pcVar5,pcVar5 + (sub->description_)._M_string_length);
  paragraphWidth = (this->super_FormatterBase).right_column_width_;
  local_218._M_dataplus._M_p = (pointer)paVar3;
  ::std::__cxx11::string::_M_construct
            ((ulong)&local_218,(char)(this->super_FormatterBase).column_width_);
  detail::streamOutAsParagraph((ostream *)local_1a8,&local_278,paragraphWidth,&local_218,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar3) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  local_278._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_278,1);
  ::std::__cxx11::stringbuf::str();
  if (local_238 != (char *)&local_228) {
    operator_delete(local_238);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_subcommand(const App *sub) const {
    std::stringstream out;
    std::string name = "  " + sub->get_display_name(true) + (sub->get_required() ? " " + get_label("REQUIRED") : "");

    out << std::setw(static_cast<int>(column_width_)) << std::left << name;
    detail::streamOutAsParagraph(
        out, sub->get_description(), right_column_width_, std::string(column_width_, ' '), true);
    out << '\n';
    return out.str();
}